

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

shared_ptr<const_fasttext::Dictionary> __thiscall fasttext::FastText::getDictionary(FastText *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_fasttext::Dictionary> sVar1;
  
  std::__shared_ptr<fasttext::Dictionary_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fasttext::Dictionary,void>
            ((__shared_ptr<fasttext::Dictionary_const,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10));
  sVar1.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_fasttext::Dictionary>)
         sVar1.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Dictionary> FastText::getDictionary() const {
  return dict_;
}